

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

string * qpdf::Name::normalize(string *__return_storage_ptr__,string *name)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  char c;
  string local_60;
  char local_39;
  ulong uStack_38;
  char ch;
  size_t i;
  undefined1 local_19;
  string *local_18;
  string *name_local;
  string *result;
  
  local_18 = name;
  name_local = __return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_19 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    pcVar2 = (char *)std::__cxx11::string::at((ulong)local_18);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
    for (uStack_38 = 1; uVar1 = uStack_38, uVar3 = std::__cxx11::string::length(), uVar1 < uVar3;
        uStack_38 = uStack_38 + 1) {
      pcVar2 = (char *)std::__cxx11::string::at((ulong)local_18);
      local_39 = *pcVar2;
      if (local_39 == '\0') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"#");
      }
      else if (((((local_39 < '!') || (local_39 == '#')) || (local_39 == '/')) ||
               (((local_39 == '(' || (local_39 == ')')) ||
                ((local_39 == '{' || ((local_39 == '}' || (local_39 == '<')))))))) ||
              ((local_39 == '>' ||
               ((((local_39 == '[' || (local_39 == ']')) || (local_39 == '%')) || ('~' < local_39)))
               ))) {
        util::hex_encode_char_abi_cxx11_(&local_60,(util *)(ulong)(uint)(int)local_39,c);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_39);
      }
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
Name::normalize(std::string const& name)
{
    if (name.empty()) {
        return name;
    }
    std::string result;
    result += name.at(0);
    for (size_t i = 1; i < name.length(); ++i) {
        char ch = name.at(i);
        // Don't use locale/ctype here; follow PDF spec guidelines.
        if (ch == '\0') {
            // QPDFTokenizer embeds a null character to encode an invalid #.
            result += "#";
        } else if (
            ch < 33 || ch == '#' || ch == '/' || ch == '(' || ch == ')' || ch == '{' || ch == '}' ||
            ch == '<' || ch == '>' || ch == '[' || ch == ']' || ch == '%' || ch > 126) {
            result += util::hex_encode_char(ch);
        } else {
            result += ch;
        }
    }
    return result;
}